

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

string * __thiscall
StatusPrinter::FormatProgressStatus_abi_cxx11_
          (string *__return_storage_ptr__,StatusPrinter *this,char *progress_status_format,
          int64_t time_millis)

{
  char cVar1;
  double rate;
  ulong uVar2;
  char cVar3;
  string out;
  char buf [32];
  
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  do {
    cVar3 = (char)&out;
    if (*progress_status_format != '%') {
      if (*progress_status_format == '\0') {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p == &out.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = out.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = out._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = out._M_string_length;
        out._M_string_length = 0;
        out.field_2._M_local_buf[0] = '\0';
        out._M_dataplus._M_p = (pointer)&out.field_2;
        std::__cxx11::string::~string((string *)&out);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back(cVar3);
      goto LAB_0011ba9a;
    }
    cVar1 = progress_status_format[1];
    progress_status_format = progress_status_format + 1;
    switch(cVar1) {
    case 'c':
      SlidingRateInfo::UpdateRate(&this->current_rate_,this->finished_edges_,this->time_millis_);
      rate = (this->current_rate_).rate_;
      goto LAB_0011ba30;
    case 'd':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'q':
switchD_0011b9ca_caseD_64:
      Fatal("unknown placeholder \'%%%c\' in $NINJA_STATUS",(ulong)(uint)(int)cVar1);
    case 'e':
      snprintf(buf,0x20,"%.3f",SUB84((double)this->time_millis_ / 1000.0,0));
      goto LAB_0011ba8f;
    case 'f':
      uVar2 = (ulong)(uint)this->finished_edges_;
      break;
    case 'o':
      rate = (double)this->finished_edges_ / ((double)this->time_millis_ / 1000.0);
LAB_0011ba30:
      SnprintfRate<32ul>(this,rate,&buf,"%.1f");
      goto LAB_0011ba8f;
    case 'p':
      snprintf(buf,0x20,"%3i%%",
               (long)(this->finished_edges_ * 100) / (long)this->total_edges_ & 0xffffffff);
      std::__cxx11::string::append((char *)&out);
      goto LAB_0011ba9a;
    case 'r':
      uVar2 = (ulong)(uint)this->running_edges_;
      break;
    case 's':
      uVar2 = (ulong)(uint)this->started_edges_;
      break;
    case 't':
      uVar2 = (ulong)(uint)this->total_edges_;
      break;
    case 'u':
      uVar2 = (ulong)(uint)(this->total_edges_ - this->started_edges_);
      break;
    default:
      if (cVar1 != '%') goto switchD_0011b9ca_caseD_64;
      std::__cxx11::string::push_back(cVar3);
      goto LAB_0011ba9a;
    }
    snprintf(buf,0x20,"%d",uVar2);
LAB_0011ba8f:
    std::__cxx11::string::append((char *)&out);
LAB_0011ba9a:
    progress_status_format = progress_status_format + 1;
  } while( true );
}

Assistant:

string StatusPrinter::FormatProgressStatus(const char* progress_status_format,
                                           int64_t time_millis) const {
  string out;
  char buf[32];
  for (const char* s = progress_status_format; *s != '\0'; ++s) {
    if (*s == '%') {
      ++s;
      switch (*s) {
      case '%':
        out.push_back('%');
        break;

        // Started edges.
      case 's':
        snprintf(buf, sizeof(buf), "%d", started_edges_);
        out += buf;
        break;

        // Total edges.
      case 't':
        snprintf(buf, sizeof(buf), "%d", total_edges_);
        out += buf;
        break;

        // Running edges.
      case 'r': {
        snprintf(buf, sizeof(buf), "%d", running_edges_);
        out += buf;
        break;
      }

        // Unstarted edges.
      case 'u':
        snprintf(buf, sizeof(buf), "%d", total_edges_ - started_edges_);
        out += buf;
        break;

        // Finished edges.
      case 'f':
        snprintf(buf, sizeof(buf), "%d", finished_edges_);
        out += buf;
        break;

        // Overall finished edges per second.
      case 'o':
        SnprintfRate(finished_edges_ / (time_millis_ / 1e3), buf, "%.1f");
        out += buf;
        break;

        // Current rate, average over the last '-j' jobs.
      case 'c':
        current_rate_.UpdateRate(finished_edges_, time_millis_);
        SnprintfRate(current_rate_.rate(), buf, "%.1f");
        out += buf;
        break;

        // Percentage
      case 'p': {
        int percent = (100 * finished_edges_) / total_edges_;
        snprintf(buf, sizeof(buf), "%3i%%", percent);
        out += buf;
        break;
      }

      case 'e': {
        snprintf(buf, sizeof(buf), "%.3f", time_millis_ / 1e3);
        out += buf;
        break;
      }

      default:
        Fatal("unknown placeholder '%%%c' in $NINJA_STATUS", *s);
        return "";
      }
    } else {
      out.push_back(*s);
    }
  }

  return out;
}